

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

Channel * __thiscall
DBOPL::Channel::BlockTemplate<(DBOPL::SynthMode)6>
          (Channel *this,Chip *chip,Bit32u samples,Bit32s *output)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Bit32u BVar4;
  long lVar5;
  ulong uVar6;
  code *pcVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined4 in_register_00000014;
  long *plVar11;
  int iVar12;
  Bitu i;
  ulong uVar13;
  
  uVar6 = CONCAT44(in_register_00000014,samples);
  iVar3 = this->op[0].totalLevel;
  if ((((this->op[0].volume + iVar3 < 0x180) ||
       ((this->op[0].rateZero >> (this->op[0].state & 0x1f) & 1) == 0)) ||
      (this[1].op[1].volume + this[1].op[1].totalLevel < 0x180)) ||
     ((this[1].op[1].rateZero >> (this[1].op[1].state & 0x1f) & 1) == 0)) {
    bVar1 = chip->tremoloValue;
    this->op[0].currentLevel = iVar3 + (uint)(this->op[0].tremoloMask & bVar1);
    BVar4 = this->op[0].waveAdd;
    this->op[0].waveCurrent = BVar4;
    bVar2 = chip->vibratoShift;
    if (this->op[0].vibStrength >> (bVar2 & 0x1f) != 0) {
      this->op[0].waveCurrent =
           (BVar4 - (int)chip->vibratoSign) +
           (this->op[0].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
    }
    this->op[1].currentLevel = (uint)(this->op[1].tremoloMask & bVar1) + this->op[1].totalLevel;
    BVar4 = this->op[1].waveAdd;
    this->op[1].waveCurrent = BVar4;
    if (this->op[1].vibStrength >> (bVar2 & 0x1f) != 0) {
      this->op[1].waveCurrent =
           (BVar4 - (int)chip->vibratoSign) +
           (this->op[1].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
    }
    this[1].op[0].currentLevel =
         (uint)(this[1].op[0].tremoloMask & bVar1) + this[1].op[0].totalLevel;
    BVar4 = this[1].op[0].waveAdd;
    this[1].op[0].waveCurrent = BVar4;
    if (this[1].op[0].vibStrength >> (bVar2 & 0x1f) != 0) {
      this[1].op[0].waveCurrent =
           (BVar4 - (int)chip->vibratoSign) +
           (this[1].op[0].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
    }
    this[1].op[1].currentLevel =
         (uint)(this[1].op[1].tremoloMask & bVar1) + this[1].op[1].totalLevel;
    BVar4 = this[1].op[1].waveAdd;
    this[1].op[1].waveCurrent = BVar4;
    if (this[1].op[1].vibStrength >> (bVar2 & 0x1f) != 0) {
      this[1].op[1].waveCurrent =
           (BVar4 - (int)chip->vibratoSign) +
           (this[1].op[1].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
    }
    for (uVar13 = 0; samples != uVar13; uVar13 = uVar13 + 1) {
      iVar3 = this->old[1];
      iVar12 = this->old[0];
      bVar1 = this->feedback;
      this->old[0] = iVar3;
      pcVar7 = (code *)this->op[0].volHandler;
      plVar11 = (long *)((long)&this->op[0].volHandler + *(long *)&this->op[0].field_0x8);
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *plVar11 + -1);
      }
      uVar9 = this->op[0].currentLevel;
      lVar5 = (*pcVar7)(plVar11,chip,uVar6);
      uVar8 = this->op[0].waveIndex + this->op[0].waveCurrent;
      uVar6 = lVar5 + (ulong)uVar9;
      iVar10 = 0;
      this->op[0].waveIndex = uVar8;
      if (uVar6 < 0x180) {
        iVar10 = (int)((uint)(ushort)(&MulTable)[uVar6] *
                      (int)this->op[0].waveBase
                           [((uint)(iVar12 + iVar3) >> (bVar1 & 0x1f)) + (uVar8 >> 0x16) &
                            this->op[0].waveMask]) >> 0x10;
      }
      this->old[1] = iVar10;
      iVar3 = this->old[0];
      uVar9 = this->op[1].currentLevel;
      pcVar7 = (code *)this->op[1].volHandler;
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *(long *)((long)&this->op[1].volHandler +
                                              *(long *)&this->op[1].field_0x8) + -1);
      }
      lVar5 = (*pcVar7)();
      uVar6 = lVar5 + (ulong)uVar9;
      uVar9 = this->op[1].waveIndex + this->op[1].waveCurrent;
      this->op[1].waveIndex = uVar9;
      if (uVar6 < 0x180) {
        iVar12 = (int)((uint)(ushort)(&MulTable)[uVar6] *
                      (int)this->op[1].waveBase[uVar9 >> 0x16 & this->op[1].waveMask]) >> 0x10;
      }
      else {
        iVar12 = 0;
      }
      uVar9 = this[1].op[0].currentLevel;
      pcVar7 = (code *)this[1].op[0].volHandler;
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *(long *)((long)&this[1].op[0].volHandler +
                                              *(long *)&this[1].op[0].field_0x8) + -1);
      }
      lVar5 = (*pcVar7)();
      uVar6 = lVar5 + (ulong)uVar9;
      uVar9 = this[1].op[0].waveIndex + this[1].op[0].waveCurrent;
      this[1].op[0].waveIndex = uVar9;
      if (uVar6 < 0x180) {
        iVar12 = (int)((uint)(ushort)(&MulTable)[uVar6] *
                      (int)this[1].op[0].waveBase[iVar12 + (uVar9 >> 0x16) & this[1].op[0].waveMask]
                      ) >> 0x10;
      }
      else {
        iVar12 = 0;
      }
      uVar9 = this[1].op[1].currentLevel;
      pcVar7 = (code *)this[1].op[1].volHandler;
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *(long *)((long)&this[1].op[1].volHandler +
                                              *(long *)&this[1].op[1].field_0x8) + -1);
      }
      lVar5 = (*pcVar7)();
      uVar8 = this[1].op[1].waveIndex + this[1].op[1].waveCurrent;
      uVar6 = lVar5 + (ulong)uVar9;
      iVar10 = 0;
      this[1].op[1].waveIndex = uVar8;
      if (uVar6 < 0x180) {
        iVar10 = (int)((uint)(ushort)(&MulTable)[uVar6] *
                      (int)this[1].op[1].waveBase[iVar12 + (uVar8 >> 0x16) & this[1].op[1].waveMask]
                      ) >> 0x10;
      }
      iVar10 = iVar10 + iVar3;
      chip = (Chip *)0xffff;
      output[uVar13 * 2] =
           output[uVar13 * 2] + ((int)this->maskLeft & (int)((uint)this->panLeft * iVar10) / 0xffff)
      ;
      iVar10 = (uint)this->panRight * iVar10;
      uVar6 = (long)iVar10 % 0xffff & 0xffffffff;
      output[uVar13 * 2 + 1] = output[uVar13 * 2 + 1] + ((int)this->maskRight & iVar10 / 0xffff);
    }
  }
  else {
    this->old[0] = 0;
    this->old[1] = 0;
  }
  return this + 2;
}

Assistant:

Channel* Channel::BlockTemplate( Chip* chip, Bit32u samples, Bit32s* output ) {
	switch( mode ) {
	case sm2AM:
	case sm3AM:
		if ( Op(0)->Silent() && Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm2FM:
	case sm3FM:
		if ( Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm3FMFM:
		if ( Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMFM:
		if ( Op(0)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3FMAM:
		if ( Op(1)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMAM:
		if ( Op(0)->Silent() && Op(2)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	default:
		break;
	}
	//Init the operators with the the current vibrato and tremolo values
	Op( 0 )->Prepare( chip );
	Op( 1 )->Prepare( chip );
	if ( mode > sm4Start ) {
		Op( 2 )->Prepare( chip );
		Op( 3 )->Prepare( chip );
	}
	if ( mode > sm6Start ) {
		Op( 4 )->Prepare( chip );
		Op( 5 )->Prepare( chip );
	}
	for ( Bitu i = 0; i < samples; i++ ) {
		//Early out for percussion handlers
		if ( mode == sm2Percussion ) {
			GeneratePercussion<false>( chip, output + i );
			continue;	//Prevent some unitialized value bitching
		} else if ( mode == sm3Percussion ) {
			GeneratePercussion<true>( chip, output + i * 2 );
			continue;	//Prevent some unitialized value bitching
		}

		//Do unsigned shift so we can shift out all bits but still stay in 10 bit range otherwise
		Bit32s mod = (Bit32u)((old[0] + old[1])) >> feedback;
		old[0] = old[1];
		old[1] = static_cast<Bit32u>(Op(0)->GetSample( mod ));
		Bit32s sample;
		Bit32s out0 = old[0];
		if ( mode == sm2AM || mode == sm3AM ) {
			sample = static_cast<Bit32u>(out0 + Op(1)->GetSample( 0 ));
		} else if ( mode == sm2FM || mode == sm3FM ) {
			sample = static_cast<Bit32u>(Op(1)->GetSample( out0 ));
		} else if ( mode == sm3FMFM ) {
			Bits next = Op(1)->GetSample( out0 );
			next = Op(2)->GetSample( next );
			sample = static_cast<Bit32u>(Op(3)->GetSample( next ));
		} else if ( mode == sm3AMFM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			next = Op(2)->GetSample( next );
			sample += static_cast<Bit32u>(Op(3)->GetSample( next ));
		} else if ( mode == sm3FMAM ) {
			sample = static_cast<Bit32u>(Op(1)->GetSample( out0 ));
			Bits next = Op(2)->GetSample( 0 );
			sample += static_cast<Bit32u>(Op(3)->GetSample( next ));
		} else if ( mode == sm3AMAM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			sample += static_cast<Bit32u>(Op(2)->GetSample( next ));
			sample += static_cast<Bit32u>(Op(3)->GetSample( 0 ));
		}
		switch( mode ) {
		case sm2AM:
		case sm2FM:
			output[ i ] += sample;
			break;
		case sm3AM:
		case sm3FM:
		case sm3FMFM:
		case sm3AMFM:
		case sm3FMAM:
		case sm3AMAM:
			output[ i * 2 + 0 ] += (sample * panLeft / 65535) & maskLeft;
			output[ i * 2 + 1 ] += (sample * panRight / 65535) & maskRight;
			break;
		default:
			break;
		}
	}
	switch( mode ) {
	case sm2AM:
	case sm2FM:
	case sm3AM:
	case sm3FM:
		return ( this + 1 );
	case sm3FMFM:
	case sm3AMFM:
	case sm3FMAM:
	case sm3AMAM:
		return( this + 2 );
	case sm2Percussion:
	case sm3Percussion:
		return( this + 3 );
	}
	return 0;
}